

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::MapFieldBase::MapBegin(MapFieldBase *this,MapIterator *map_iter)

{
  UntypedMapBase *pUVar1;
  btree<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
  *this_00;
  reference ppVar2;
  undefined1 uVar3;
  NodeBase *entry;
  uint uVar4;
  iterator iVar5;
  btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_&,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_*>
  local_38;
  
  entry = (NodeBase *)0x0;
  uVar3 = 0;
  pUVar1 = (*((this->super_MapFieldBaseForParse).vtable_)->get_map)
                     (&this->super_MapFieldBaseForParse,false);
  uVar4 = pUVar1->index_of_first_non_null_;
  if (uVar4 == pUVar1->num_buckets_) {
    uVar4 = 0;
  }
  else {
    entry = (NodeBase *)pUVar1->table_[uVar4];
    if (((ulong)entry & 1) != 0) {
      this_00 = (btree<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
                 *)TableEntryToTree((TableEntryPtr)entry);
      iVar5 = absl::lts_20240722::container_internal::
              btree<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
              ::begin(this_00);
      local_38.node_ = iVar5.node_;
      local_38.position_ = iVar5.position_;
      ppVar2 = absl::lts_20240722::container_internal::
               btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_&,_std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_*>
               ::operator*(&local_38);
      entry = ppVar2->second;
    }
    if (entry == (NodeBase *)0x0) {
      protobuf_assumption_failed
                ("node != nullptr",
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/map.h"
                 ,0x33d);
    }
  }
  (map_iter->iter_).node_ = entry;
  (map_iter->iter_).m_ = pUVar1;
  (map_iter->iter_).bucket_index_ = uVar4;
  (*(this->super_MapFieldBaseForParse).vtable_[3].get_map)
            ((MapFieldBaseForParse *)map_iter,(bool)uVar3);
  return;
}

Assistant:

void MapFieldBase::MapBegin(MapIterator* map_iter) const {
  map_iter->iter_ = GetMap().begin();
  SetMapIteratorValue(map_iter);
}